

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceTest_TestNonZeroImplicitSubMessageMapEntriesHavePresence_Test::
~NoFieldPresenceTest_TestNonZeroImplicitSubMessageMapEntriesHavePresence_Test
          (NoFieldPresenceTest_TestNonZeroImplicitSubMessageMapEntriesHavePresence_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NoFieldPresenceTest, TestNonZeroImplicitSubMessageMapEntriesHavePresence) {
  TestAllMapTypes message;
  const Reflection* r = message.GetReflection();
  const Descriptor* desc = message.GetDescriptor();

  const FieldDescriptor* field_map_int32_foreign_message =
      desc->FindFieldByName("map_int32_foreign_message");

  // Set nonzero values for key-value pairs and test that.
  (*message.mutable_map_int32_foreign_message())[123].set_c(10101);

  const google::protobuf::Message& msg_map_entry = r->GetRepeatedMessage(
      message, field_map_int32_foreign_message, /*index=*/0);

  // Fields in map entries inherit field_presence from file defaults. If a map
  // is a "no presence" field, its key is also considered "no presence" from POV
  // of the descriptor. (Even though the key itself behaves like a normal index
  // with zeroes being valid indices). One day we will change this...
  EXPECT_THAT(msg_map_entry, Not(MapEntryKeyExplicitPresence()));

  // Message types always have presence in proto3.
  EXPECT_THAT(msg_map_entry, MapEntryValueExplicitPresence());
}